

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateExport.cpp
# Opt level: O0

void helicsFederateCosimulationTerminationCallback
               (HelicsFederate fed,_func_void_void_ptr *cosimTermination,void *userdata,
               HelicsError *err)

{
  Federate *pFVar1;
  Federate *in_RDX;
  function<void_()> *in_RSI;
  Federate *fedptr;
  function<void_()> *in_stack_ffffffffffffff60;
  anon_class_16_2_c08cd395 *in_stack_ffffffffffffff68;
  function<void_()> *in_stack_ffffffffffffff70;
  function<void_()> *in_stack_ffffffffffffff78;
  Federate *in_stack_ffffffffffffff80;
  
  pFVar1 = getFed(in_stack_ffffffffffffff70,(HelicsError *)in_stack_ffffffffffffff68);
  if (pFVar1 != (Federate *)0x0) {
    if (in_RSI == (function<void_()> *)0x0) {
      std::function<void_()>::function(in_stack_ffffffffffffff60);
      helics::Federate::setCosimulationTerminatedCallback
                (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      std::function<void_()>::~function((function<void_()> *)0x1bd416);
    }
    else {
      std::function<void()>::function<helicsFederateCosimulationTerminationCallback::__0,void>
                (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
      helics::Federate::setCosimulationTerminatedCallback(in_RDX,in_RSI);
      std::function<void_()>::~function((function<void_()> *)0x1bd489);
    }
  }
  return;
}

Assistant:

void helicsFederateCosimulationTerminationCallback(HelicsFederate fed,
                                                   void (*cosimTermination)(void* userdata),
                                                   void* userdata,
                                                   HelicsError* err)
{
    auto* fedptr = getFed(fed, err);
    if (fedptr == nullptr) {
        return;
    }

    try {
        if (cosimTermination == nullptr) {
            fedptr->setCosimulationTerminatedCallback({});
        } else {
            fedptr->setCosimulationTerminatedCallback([cosimTermination, userdata]() { cosimTermination(userdata); });
        }
    }
    catch (...) {  // LCOV_EXCL_LINE
        helicsErrorHandler(err);  // LCOV_EXCL_LINE
    }
}